

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O2

void xc_lda(xc_func_type *p,size_t np,double *rho,double *zk,double *vrho,double *v2rho2,
           double *v3rho3,double *v4rho4)

{
  int iVar1;
  int iVar2;
  xc_lda_out_params local_30;
  
  iVar2 = 1;
  if (vrho == (double *)0x0) {
    iVar2 = -(uint)(zk == (double *)0x0);
  }
  iVar1 = 2;
  if (v2rho2 == (double *)0x0) {
    iVar1 = iVar2;
  }
  iVar2 = 3;
  if (v3rho3 == (double *)0x0) {
    iVar2 = iVar1;
  }
  iVar1 = 4;
  if (v4rho4 == (double *)0x0) {
    iVar1 = iVar2;
  }
  if (-1 < iVar1) {
    local_30.v3rho3 = v3rho3;
    local_30.v4rho4 = v4rho4;
    local_30.zk = zk;
    local_30.vrho = vrho;
    local_30.v2rho2 = v2rho2;
    xc_lda_new(p,iVar1,np,rho,&local_30);
  }
  return;
}

Assistant:

void
xc_lda(const xc_func_type *p, size_t np, const double *rho, double *zk, double *vrho, double *v2rho2, double *v3rho3, double *v4rho4)
{
  int order = -1;

  if(zk     != NULL) order = 0;
  if(vrho   != NULL) order = 1;
  if(v2rho2 != NULL) order = 2;
  if(v3rho3 != NULL) order = 3;
  if(v4rho4 != NULL) order = 4;

  if(order < 0) return;

  xc_lda_out_params out;
  libxc_memset(&out, 0, sizeof(xc_lda_out_params));
  out.zk     = zk;
  out.vrho   = vrho;
  out.v2rho2 = v2rho2;
  out.v3rho3 = v3rho3;
  out.v4rho4 = v4rho4;

  xc_lda_new(p, order, np, rho, &out);
}